

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O0

void improve_attack_modifier
               (player *p,object *obj,monster *mon,int *brand_used,int *slay_used,char *verb,
               _Bool range)

{
  _Bool _Var1;
  wchar_t wVar2;
  brand_conflict *pbVar3;
  slay_conflict *slay;
  wchar_t local_80;
  wchar_t local_7c;
  wchar_t mult_1;
  slay_conflict *s_1;
  wchar_t mult;
  brand_conflict *b_1;
  slay_conflict *s;
  brand_conflict *b;
  wchar_t local_40;
  wchar_t best_mult;
  wchar_t i;
  _Bool range_local;
  char *verb_local;
  int *slay_used_local;
  int *brand_used_local;
  monster *mon_local;
  object *obj_local;
  player *p_local;
  
  b._4_4_ = L'\x01';
  if (*brand_used == 0) {
    if (*slay_used != 0) {
      if (slays[*slay_used].multiplier < 2) {
        local_80 = L'\x01';
      }
      else {
        local_80 = slays[*slay_used].multiplier;
      }
      b._4_4_ = local_80;
    }
  }
  else {
    pbVar3 = brands + *brand_used;
    wVar2 = get_monster_brand_multiplier(mon,pbVar3);
    if (wVar2 < L'\x02') {
      local_7c = L'\x01';
    }
    else {
      local_7c = get_monster_brand_multiplier(mon,pbVar3);
    }
    b._4_4_ = local_7c;
  }
  for (local_40 = L'\x01'; local_40 < (int)(uint)z_info->brand_max; local_40 = local_40 + L'\x01') {
    pbVar3 = brands + local_40;
    if (obj == (object *)0x0) {
      _Var1 = player_has_temporary_brand(p,local_40);
      if (_Var1) goto LAB_001ed7a6;
    }
    else if ((obj->brands != (_Bool *)0x0) && ((obj->brands[local_40] & 1U) != 0)) {
LAB_001ed7a6:
      _Var1 = flag_has_dbg(mon->race->flags,0xc,pbVar3->resist_flag,"mon->race->flags",
                           "b->resist_flag");
      if ((!_Var1) && (wVar2 = get_monster_brand_multiplier(mon,pbVar3), b._4_4_ < wVar2)) {
        *brand_used = local_40;
        my_strcpy(verb,pbVar3->verb,0x14);
        b._4_4_ = wVar2;
        if (range) {
          my_strcat(verb,"s",0x14);
        }
      }
    }
  }
  local_40 = L'\x01';
  do {
    if ((int)(uint)z_info->slay_max <= local_40) {
      return;
    }
    slay = slays + local_40;
    if (obj == (object *)0x0) {
      _Var1 = player_has_temporary_slay(p,local_40);
      if (_Var1) goto LAB_001ed8bb;
    }
    else if ((obj->slays != (_Bool *)0x0) && ((obj->slays[local_40] & 1U) != 0)) {
LAB_001ed8bb:
      _Var1 = react_to_specific_slay(slay,mon);
      if ((_Var1) && (wVar2 = slay->multiplier, b._4_4_ < wVar2)) {
        *brand_used = 0;
        *slay_used = local_40;
        b._4_4_ = wVar2;
        if (range) {
          my_strcpy(verb,slay->range_verb,0x14);
        }
        else {
          my_strcpy(verb,slay->melee_verb,0x14);
        }
      }
    }
    local_40 = local_40 + L'\x01';
  } while( true );
}

Assistant:

void improve_attack_modifier(struct player *p, struct object *obj,
	const struct monster *mon, int *brand_used, int *slay_used,
	char *verb, bool range)
{
	int i, best_mult = 1;

	/* Set the current best multiplier */
	if (*brand_used) {
		struct brand *b = &brands[*brand_used];
		best_mult = MAX(best_mult,
			get_monster_brand_multiplier(mon, b));
	} else if (*slay_used) {
		struct slay *s = &slays[*slay_used];
		best_mult = MAX(best_mult, s->multiplier);
	}

	/* Brands */
	for (i = 1; i < z_info->brand_max; i++) {
		struct brand *b = &brands[i];
		if (obj) {
			/* Brand is on an object */
			if (!obj->brands || !obj->brands[i]) continue;
		} else {
			/* Temporary brand */
			if (!player_has_temporary_brand(p, i)) continue;
		}
 
		/* Is the monster vulnerable? */
		if (!rf_has(mon->race->flags, b->resist_flag)) {
			int mult = get_monster_brand_multiplier(mon, b);

			/* Record the best multiplier */
			if (best_mult < mult) {
				best_mult = mult;
				*brand_used = i;
				my_strcpy(verb, b->verb, 20);
				if (range)
					my_strcat(verb, "s", 20);
			}
		}
	}

	/* Slays */
	for (i = 1; i < z_info->slay_max; i++) {
		struct slay *s = &slays[i];
		if (obj) {
			/* Slay is on an object */
			if (!obj->slays || !obj->slays[i]) continue;
		} else {
			/* Temporary slay */
			if (!player_has_temporary_slay(p, i)) continue;
		}
 
		/* Is the monster is vulnerable? */
		if (react_to_specific_slay(s, mon)) {
			int mult = s->multiplier;

			/* Record the best multiplier */
			if (best_mult < mult) {
				best_mult = mult;
				*brand_used = 0;
				*slay_used = i;
				if (range) {
					my_strcpy(verb, s->range_verb, 20);
				} else {
					my_strcpy(verb, s->melee_verb, 20);
				}
			}
		}
	}
}